

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.h
# Opt level: O0

bool google::protobuf::compiler::java::CheckUtf8(FieldDescriptor *descriptor)

{
  JavaFeatures_Utf8Validation JVar1;
  FeatureSet_Utf8Validation FVar2;
  FeatureSet *pFVar3;
  ConstType this;
  FileDescriptor *this_00;
  FileOptions *this_01;
  bool local_19;
  FieldDescriptor *descriptor_local;
  
  pFVar3 = CodeGenerator::GetResolvedSourceFeatures<google::protobuf::FieldDescriptor>(descriptor);
  this = FeatureSet::
         GetExtension<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false,_0>
                   (pFVar3,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                            *)pb::java);
  JVar1 = pb::JavaFeatures::utf8_validation(this);
  if (JVar1 == JavaFeatures_Utf8Validation_VERIFY) {
    descriptor_local._7_1_ = true;
  }
  else {
    pFVar3 = CodeGenerator::GetResolvedSourceFeatures<google::protobuf::FieldDescriptor>(descriptor)
    ;
    FVar2 = FeatureSet::utf8_validation(pFVar3);
    local_19 = true;
    if (FVar2 != FeatureSet_Utf8Validation_VERIFY) {
      this_00 = FieldDescriptor::file(descriptor);
      this_01 = FileDescriptor::options(this_00);
      local_19 = FileOptions::java_string_check_utf8(this_01);
    }
    descriptor_local._7_1_ = local_19;
  }
  return descriptor_local._7_1_;
}

Assistant:

inline bool CheckUtf8(const FieldDescriptor* descriptor) {
  if (JavaGenerator::GetResolvedSourceFeatures(*descriptor)
          .GetExtension(pb::java)
          .utf8_validation() == pb::JavaFeatures::VERIFY) {
    return true;
  }
  return JavaGenerator::GetResolvedSourceFeatures(*descriptor)
                 .utf8_validation() == FeatureSet::VERIFY ||
         // For legacy syntax. This is not allowed under Editions.
         descriptor->file()->options().java_string_check_utf8();
}